

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O3

void __thiscall
duckdb::PatasScanState<float>::ScanGroup<unsigned_int,false>
          (PatasScanState<float> *this,uint *values,idx_t group_size)

{
  if (((this->total_value_count & 0x3ff) == 0) && (this->total_value_count < this->count)) {
    if (group_size == 0x400) {
      LoadGroup<false>(this,values);
      group_size = 0x400;
      goto LAB_0172d156;
    }
    LoadGroup<false>(this,(this->group_state).values);
  }
  switchD_012b9b0d::default
            (values,(this->group_state).values + (this->group_state).index,group_size * 4);
  (this->group_state).index = (this->group_state).index + group_size;
LAB_0172d156:
  this->total_value_count = this->total_value_count + group_size;
  return;
}

Assistant:

void ScanGroup(EXACT_TYPE *values, idx_t group_size) {
		D_ASSERT(group_size <= PatasPrimitives::PATAS_GROUP_SIZE);
		D_ASSERT(group_size <= LeftInGroup());

		if (GroupFinished() && total_value_count < count) {
			if (group_size == PatasPrimitives::PATAS_GROUP_SIZE) {
				LoadGroup<SKIP>(values);
				total_value_count += group_size;
				return;
			} else {
				// Even if SKIP is given, group size is not big enough to be able to fully skip the entire group
				LoadGroup<false>(group_state.values);
			}
		}
		group_state.template Scan<SKIP>((uint8_t *)values, group_size);

		total_value_count += group_size;
	}